

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O1

int __thiscall QPicture::metric(QPicture *this,PaintDeviceMetric m)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  int iVar4;
  QRect QVar5;
  
  QVar5 = boundingRect(this);
  auVar3 = QVar5._0_12_;
  iVar4 = 0x1000000;
  switch(m) {
  case PdmHeight:
    auVar1._8_8_ = QVar5._8_8_ >> 0x20;
    auVar1._0_8_ = QVar5._0_8_ >> 0x20;
    auVar3 = auVar1._0_12_;
  case PdmWidth:
    iVar4 = (auVar3._8_4_ - auVar3._0_4_) + 1;
    break;
  case PdmWidthMM:
    iVar4 = qt_defaultDpiX();
    goto LAB_002af95c;
  case PdmHeightMM:
    iVar4 = qt_defaultDpiY();
    auVar2._8_8_ = QVar5._8_8_ >> 0x20;
    auVar2._0_8_ = QVar5._0_8_ >> 0x20;
    auVar3 = auVar2._0_12_;
LAB_002af95c:
    iVar4 = (int)((double)((auVar3._8_4_ - auVar3._0_4_) + 1) * (25.4 / (double)iVar4));
    break;
  case PdmNumColors:
    break;
  case PdmDepth:
    iVar4 = 0x18;
    break;
  case PdmDpiX:
  case PdmPhysicalDpiX:
    iVar4 = qt_defaultDpiX();
    return iVar4;
  case PdmDpiY:
  case PdmPhysicalDpiY:
    iVar4 = qt_defaultDpiY();
    return iVar4;
  case PdmDevicePixelRatio:
    iVar4 = 1;
    break;
  case PdmDevicePixelRatioScaled:
    iVar4 = 0x10000;
    break;
  default:
    metric();
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int QPicture::metric(PaintDeviceMetric m) const
{
    int val;
    QRect brect = boundingRect();
    switch (m) {
        case PdmWidth:
            val = brect.width();
            break;
        case PdmHeight:
            val = brect.height();
            break;
        case PdmWidthMM:
            val = int(25.4/qt_defaultDpiX()*brect.width());
            break;
        case PdmHeightMM:
            val = int(25.4/qt_defaultDpiY()*brect.height());
            break;
        case PdmDpiX:
        case PdmPhysicalDpiX:
            val = qt_defaultDpiX();
            break;
        case PdmDpiY:
        case PdmPhysicalDpiY:
            val = qt_defaultDpiY();
            break;
        case PdmNumColors:
            val = 16777216;
            break;
        case PdmDepth:
            val = 24;
            break;
        case PdmDevicePixelRatio:
            val = 1;
            break;
        case PdmDevicePixelRatioScaled:
            val = 1 * QPaintDevice::devicePixelRatioFScale();
            break;
        default:
            val = 0;
            qWarning("QPicture::metric: Invalid metric command");
    }
    return val;
}